

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::f32_Convert_i32u(w3Interp *this)

{
  uint32_t *puVar1;
  w3Interp *this_local;
  
  puVar1 = w3Stack::u32(&this->super_w3Stack);
  w3Stack::set_f32(&this->super_w3Stack,(float)*puVar1);
  return;
}

Assistant:

INTERP (f32_Convert_i32u)
{
    set_f32 ((float)(uint32_t)u32 ());
}